

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64compiler.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::a64::Compiler::onAttach(Compiler *this,CodeHolder *code)

{
  Error EVar1;
  
  EVar1 = BaseCompiler::onAttach(&this->super_BaseCompiler,code);
  if (EVar1 == 0) {
    EVar1 = BaseBuilder::addPassT<asmjit::v1_14::a64::ARMRAPass>((BaseBuilder *)this);
    if (EVar1 == 0) {
      (this->super_BaseCompiler).super_BaseBuilder.super_BaseEmitter._instructionAlignment = '\x04';
      EVar1 = 0;
      assignEmitterFuncs((BaseEmitter *)this);
    }
    else {
      (*(this->super_BaseCompiler).super_BaseBuilder.super_BaseEmitter._vptr_BaseEmitter[0x11])
                (this,code);
    }
  }
  return EVar1;
}

Assistant:

Error Compiler::onAttach(CodeHolder* code) noexcept {
  ASMJIT_PROPAGATE(Base::onAttach(code));
  Error err = addPassT<ARMRAPass>();

  if (ASMJIT_UNLIKELY(err)) {
    onDetach(code);
    return err;
  }

  _instructionAlignment = uint8_t(4);
  assignEmitterFuncs(this);

  return kErrorOk;
}